

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

string * __thiscall
cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>> *this)

{
  any *paVar1;
  any *this_00;
  any *paVar2;
  string str;
  long local_a0;
  _Alloc_hider local_98;
  size_type local_90;
  char local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  string *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(long *)(this + 0x38) == *(long *)(this + 0x18)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"{}",(allocator *)&local_98);
  }
  else {
    local_78 = __return_storage_ptr__;
    std::__cxx11::string::string((string *)&local_98,"{",(allocator *)&local_50);
    this_00 = *(any **)(this + 0x18);
    paVar2 = *(any **)(this + 0x28);
    local_a0 = *(long *)(this + 0x30);
    paVar1 = *(any **)(this + 0x38);
    while (this_00 != paVar1) {
      any::to_string_abi_cxx11_(&local_70,this_00);
      std::operator+(&local_50,&local_70,", ");
      std::__cxx11::string::append((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = this_00 + 1;
      if (this_00 == paVar2) {
        this_00 = *(any **)(local_a0 + 8);
        local_a0 = local_a0 + 8;
        paVar2 = this_00 + 0x40;
      }
    }
    std::__cxx11::string::resize((ulong)&local_98);
    std::__cxx11::string::append((char *)&local_98);
    __return_storage_ptr__ = local_78;
    (local_78->_M_dataplus)._M_p = (pointer)&local_78->field_2;
    if (local_98._M_p == &local_88) {
      (local_78->field_2)._M_allocated_capacity = CONCAT71(uStack_87,local_88);
      *(undefined8 *)((long)&local_78->field_2 + 8) = uStack_80;
    }
    else {
      (local_78->_M_dataplus)._M_p = local_98._M_p;
      (local_78->field_2)._M_allocated_capacity = CONCAT71(uStack_87,local_88);
    }
    local_78->_M_string_length = local_90;
    local_90 = 0;
    local_88 = '\0';
    local_98._M_p = &local_88;
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}